

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cpio_bin_xz.c
# Opt level: O2

void test_read_format_cpio_bin_xz(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *a;
  archive_entry *ae;
  
  a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_xz.c"
                   ,L'4',(uint)(a != (archive *)0x0),"(a = archive_read_new()) != NULL",(void *)0x0)
  ;
  iVar1 = archive_read_support_filter_all(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_xz.c"
                      ,L'5',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_filter_xz(a);
  if (iVar1 == -0x14) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_xz.c"
                   ,L'8');
    test_skipping("xz reading not fully supported on this platform");
    iVar1 = archive_read_free(a);
    wVar2 = L'9';
  }
  else {
    iVar1 = archive_read_support_format_all(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_xz.c"
                        ,L'<',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
    iVar1 = archive_read_open_memory(a,archive,0x74);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_xz.c"
                        ,L'>',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_read_open_memory(a, archive, sizeof(archive))",a);
    iVar1 = archive_read_next_header(a,&ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_xz.c"
                        ,L'?',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    iVar1 = archive_filter_code(a,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_xz.c"
                        ,L'@',(long)iVar1,"archive_filter_code(a, 0)",6,"ARCHIVE_FILTER_XZ",
                        (void *)0x0);
    iVar1 = archive_format(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_xz.c"
                        ,L'A',(long)iVar1,"archive_format(a)",0x10002,"ARCHIVE_FORMAT_CPIO_BIN_LE",
                        (void *)0x0);
    wVar2 = archive_entry_is_encrypted(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_xz.c"
                        ,L'B',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_xz.c"
                        ,L'C',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                        "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a);
    iVar1 = archive_read_close(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_xz.c"
                        ,L'D',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
    iVar1 = archive_read_free(a);
    wVar2 = L'E';
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_bin_xz.c"
                      ,wVar2,0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_cpio_bin_xz)
{
	struct archive_entry *ae;
	struct archive *a;
	int r;

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	r = archive_read_support_filter_xz(a);
	if (r == ARCHIVE_WARN) {
		skipping("xz reading not fully supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, archive, sizeof(archive)));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_XZ);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_CPIO_BIN_LE);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}